

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::dht_stats_alert::dht_stats_alert
          (dht_stats_alert *this,stack_allocator *param_1,
          vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
          *table,vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_> *requests)

{
  vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_> *requests_local;
  vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>
  *table_local;
  stack_allocator *param_1_local;
  dht_stats_alert *this_local;
  
  libtorrent::alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__dht_stats_alert_00991d78;
  std::vector<libtorrent::dht_lookup,_std::allocator<libtorrent::dht_lookup>_>::vector
            (&this->active_requests,requests);
  std::vector<libtorrent::dht_routing_bucket,_std::allocator<libtorrent::dht_routing_bucket>_>::
  vector(&this->routing_table,table);
  return;
}

Assistant:

dht_stats_alert::dht_stats_alert(aux::stack_allocator&
		, std::vector<dht_routing_bucket> table
		, std::vector<dht_lookup> requests)
		: alert()
		, active_requests(std::move(requests))
		, routing_table(std::move(table))
	{}